

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_format(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  int *in_RCX;
  char *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  int unaff_retaddr;
  ulong in_stack_00000008;
  vm_val_t *in_stack_00000010;
  vm_val_t *lead_fill;
  int exp_digits;
  int frac_digits;
  int whole_places;
  uint flags;
  int max_digits;
  int orig_argc;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint *in_stack_ffffffffffffff80;
  vm_val_t *in_stack_ffffffffffffff88;
  int local_64;
  vm_val_t *local_48;
  undefined4 in_stack_ffffffffffffffe8;
  vm_obj_id_t self_00;
  
  self_00 = (vm_obj_id_t)((ulong)in_RDI >> 0x20);
  if (in_RCX == (int *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = *in_RCX;
  }
  local_48 = (vm_val_t *)0x0;
  if ((getp_format(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_format(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_format::desc,0,6);
    __cxa_guard_release(&getp_format(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (iVar1 == 0) {
    if (0 < local_64) {
      CVmBif::pop_int_or_nil(0x305540);
    }
    if (1 < local_64) {
      CVmBif::pop_int_or_nil(0x305552);
    }
    if (2 < local_64) {
      CVmBif::pop_int_or_nil(0x305567);
    }
    if (3 < local_64) {
      CVmBif::pop_int_or_nil(0x30557c);
    }
    if (4 < local_64) {
      CVmBif::pop_int_or_nil(0x305591);
    }
    if (5 < local_64) {
      local_48 = CVmStack::get(0);
    }
    cvt_to_string(self_00,(vm_val_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                  (int)((ulong)in_RCX >> 0x20),(int)in_RCX,local_64,unaff_retaddr,in_stack_00000008,
                  in_stack_00000010);
    if (local_48 != (vm_val_t *)0x0) {
      CVmStack::discard();
    }
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_format(VMG_ vm_obj_id_t self,
                              vm_val_t *retval, uint *argc)
{
    int orig_argc = (argc != 0 ? *argc : 0);
    int max_digits = -1;
    uint flags = 0;
    int whole_places = -1;
    int frac_digits = -1;
    int exp_digits = -1;
    vm_val_t *lead_fill = 0;
    static CVmNativeCodeDesc desc(0, 6);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the maximum digit count */
    if (orig_argc >= 1)
        max_digits = CVmBif::pop_int_or_nil(vmg_ -1);

    /* get the flags */
    if (orig_argc >= 2)
        flags = CVmBif::pop_int_or_nil(vmg_ 0);

    /* get the whole places */
    if (orig_argc >= 3)
        whole_places = CVmBif::pop_int_or_nil(vmg_ -1);

    /* get the fraction digits */
    if (orig_argc >= 4)
        frac_digits = CVmBif::pop_int_or_nil(vmg_ -1);

    /* get the exponent digits */
    if (orig_argc >= 5)
        exp_digits = CVmBif::pop_int_or_nil(vmg_ -1);

    /* 
     *   get the lead fill string if provided (leave it on the stack to
     *   protect against garbage collection) 
     */
    if (orig_argc >= 6)
        lead_fill = G_stk->get(0);

    /* format the number, which will build the return string */
    cvt_to_string(vmg_ self, retval, ext_, max_digits, whole_places,
                  frac_digits, exp_digits, flags, lead_fill);

    /* discard the lead fill string, if provided */
    if (lead_fill != 0)
        G_stk->discard();

    /* handled */
    return TRUE;
}